

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usprep.cpp
# Opt level: O2

int32_t usprep_map(UStringPrepProfile *profile,UChar *src,int32_t srcLength,UChar *dest,
                  int32_t destCapacity,int32_t options,UParseError *parseError,UErrorCode *status)

{
  UChar UVar1;
  UChar UVar2;
  uint16_t *puVar3;
  uint uVar4;
  uint16_t trieWord;
  int32_t iVar5;
  UStringPrepType UVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ulong uStack_80;
  UBool isIndex;
  int32_t local_70;
  int16_t value;
  UChar *local_68;
  ulong local_60;
  UChar *local_58;
  uint local_4c;
  long local_48;
  UErrorCode *local_40;
  UParseError *local_38;
  
  local_40 = status;
  local_38 = parseError;
  local_4c = options & 1;
  local_48 = (long)destCapacity;
  local_60 = 0;
  iVar13 = 0;
  local_70 = destCapacity;
  local_68 = dest;
  local_58 = src;
LAB_002df9df:
  do {
    if (srcLength <= iVar13) {
      iVar5 = u_terminateUChars_63(local_68,local_70,(int32_t)local_60,local_40);
      return iVar5;
    }
    iVar12 = iVar13 + 1;
    UVar1 = local_58[iVar13];
    uVar11 = (uint)(ushort)UVar1;
    if (iVar12 == srcLength || (uVar11 & 0xfc00) != 0xd800) {
LAB_002dfa99:
      puVar3 = (profile->sprepTrie).index;
      uVar4 = ((ushort)UVar1 >> 5) + 0x140;
      if ((uVar11 & 0xfc00) != 0xd800) {
        uVar4 = (uint)((ushort)UVar1 >> 5);
      }
      trieWord = puVar3[(uVar11 & 0x1f) + (uint)puVar3[uVar4] * 4];
      iVar13 = -1;
    }
    else {
      UVar2 = local_58[iVar12];
      if (((ushort)UVar2 & 0xfc00) != 0xdc00) goto LAB_002dfa99;
      iVar12 = iVar13 + 2;
      uVar11 = (uint)(ushort)UVar1 * 0x400 + (uint)(ushort)UVar2 + 0xfca02400;
      if ((uVar11 < 0x110000) &&
         (puVar3 = (profile->sprepTrie).index,
         iVar5 = (*(profile->sprepTrie).getFoldingOffset)
                           ((uint32_t)
                            puVar3[(uVar11 >> 10 & 0x1f) +
                                   (uint)puVar3[(uVar11 >> 10) + 0xd7c0 >> 5] * 4]), 0 < iVar5)) {
        puVar3 = (profile->sprepTrie).index;
        trieWord = puVar3[((ushort)UVar2 & 0x1f) +
                          (uint)puVar3[iVar5 + ((ushort)UVar2 >> 5 & 0x1f)] * 4];
      }
      else {
        trieWord = (uint16_t)(profile->sprepTrie).initialValue;
      }
      iVar13 = -2;
    }
    UVar6 = getValues(trieWord,&value,&isIndex);
    if (UVar6 == USPREP_UNASSIGNED && local_4c == 0) {
      uprv_syntaxError_63(local_58,iVar12 + iVar13,srcLength,local_38);
      *local_40 = U_IDNA_UNASSIGNED_ERROR;
      return 0;
    }
    iVar13 = iVar12;
  } while (UVar6 == USPREP_DELETE);
  iVar12 = (int)local_60;
  lVar9 = (long)iVar12;
  if (UVar6 == USPREP_MAP) {
    iVar7 = (int)value;
    if (isIndex != '\0') {
      if (iVar7 < profile->indexes[3] || profile->indexes[4] <= iVar7) {
        if (iVar7 < profile->indexes[4] || profile->indexes[5] <= iVar7) {
          if ((iVar7 < profile->indexes[5]) || (profile->indexes[6] <= iVar7)) {
            lVar8 = (long)iVar7;
            iVar7 = iVar7 + 1;
            uStack_80 = (ulong)profile->mappingData[lVar8];
          }
          else {
            uStack_80 = 3;
          }
        }
        else {
          uStack_80 = 2;
        }
      }
      else {
        uStack_80 = 1;
      }
      lVar8 = (long)iVar7;
      for (lVar10 = 0; -lVar10 != uStack_80; lVar10 = lVar10 + -1) {
        if (lVar9 < local_48) {
          local_68[lVar9] = profile->mappingData[lVar8];
        }
        lVar9 = lVar9 + 1;
        lVar8 = lVar8 + 1;
      }
      local_60 = (ulong)(uint)(iVar12 - (int)lVar10);
      goto LAB_002df9df;
    }
    uVar11 = uVar11 - iVar7;
  }
  if ((int)uVar11 < 0x10000) {
    if (iVar12 < local_70) {
      local_68[lVar9] = (UChar)uVar11;
    }
    local_60 = (ulong)(iVar12 + 1);
  }
  else {
    if (iVar12 + 1 < local_70) {
      local_68[lVar9] = (short)(uVar11 >> 10) + L'ퟀ';
      local_68[iVar12 + 1] = (UChar)uVar11 & 0x3ffU | 0xdc00;
    }
    local_60 = (ulong)(iVar12 + 2);
  }
  goto LAB_002df9df;
}

Assistant:

static int32_t 
usprep_map(  const UStringPrepProfile* profile, 
             const UChar* src, int32_t srcLength, 
             UChar* dest, int32_t destCapacity,
             int32_t options,
             UParseError* parseError,
             UErrorCode* status ){
    
    uint16_t result;
    int32_t destIndex=0;
    int32_t srcIndex;
    UBool allowUnassigned = (UBool) ((options & USPREP_ALLOW_UNASSIGNED)>0);
    UStringPrepType type;
    int16_t value;
    UBool isIndex;
    const int32_t* indexes = profile->indexes;

    // no error checking the caller check for error and arguments
    // no string length check the caller finds out the string length

    for(srcIndex=0;srcIndex<srcLength;){
        UChar32 ch;

        U16_NEXT(src,srcIndex,srcLength,ch);
        
        result=0;

        UTRIE_GET16(&profile->sprepTrie,ch,result);
        
        type = getValues(result, value, isIndex);

        // check if the source codepoint is unassigned
        if(type == USPREP_UNASSIGNED && allowUnassigned == FALSE){

            uprv_syntaxError(src,srcIndex-U16_LENGTH(ch), srcLength,parseError);
            *status = U_STRINGPREP_UNASSIGNED_ERROR;
            return 0;
            
        }else if(type == USPREP_MAP){
            
            int32_t index, length;

            if(isIndex){
                index = value;
                if(index >= indexes[_SPREP_ONE_UCHAR_MAPPING_INDEX_START] &&
                         index < indexes[_SPREP_TWO_UCHARS_MAPPING_INDEX_START]){
                    length = 1;
                }else if(index >= indexes[_SPREP_TWO_UCHARS_MAPPING_INDEX_START] &&
                         index < indexes[_SPREP_THREE_UCHARS_MAPPING_INDEX_START]){
                    length = 2;
                }else if(index >= indexes[_SPREP_THREE_UCHARS_MAPPING_INDEX_START] &&
                         index < indexes[_SPREP_FOUR_UCHARS_MAPPING_INDEX_START]){
                    length = 3;
                }else{
                    length = profile->mappingData[index++];
         
                }

                /* copy mapping to destination */
                for(int32_t i=0; i< length; i++){
                    if(destIndex < destCapacity  ){
                        dest[destIndex] = profile->mappingData[index+i];
                    }
                    destIndex++; /* for pre-flighting */
                }  
                continue;
            }else{
                // subtract the delta to arrive at the code point
                ch -= value;
            }

        }else if(type==USPREP_DELETE){
             // just consume the codepoint and contine
            continue;
        }
        //copy the code point into destination
        if(ch <= 0xFFFF){
            if(destIndex < destCapacity ){
                dest[destIndex] = (UChar)ch;
            }
            destIndex++;
        }else{
            if(destIndex+1 < destCapacity ){
                dest[destIndex]   = U16_LEAD(ch);
                dest[destIndex+1] = U16_TRAIL(ch);
            }
            destIndex +=2;
        }
       
    }
        
    return u_terminateUChars(dest, destCapacity, destIndex, status);
}